

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestAny::ByteSizeLong(TestAny *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  RepeatedPtrField<google::protobuf::Any> *this_00;
  reference value;
  uint32_t *puVar5;
  ulong uVar6;
  string *value_00;
  size_t sVar7;
  Any *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::Any> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAny *this_;
  TestAny *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_repeated_any_value_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_repeated_any_value(this);
  __end2 = google::protobuf::RepeatedPtrField<google::protobuf::Any>::begin(this_00);
  msg = (Any *)google::protobuf::RepeatedPtrField<google::protobuf::Any>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::Any>::operator*
                      (&__end2);
    sVar7 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>(value);
    sStack_58 = sVar7 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::Any>::operator++
              (&__end2);
  }
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_text_abi_cxx11_(this);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        value_00 = _internal_text_abi_cxx11_(this);
        sVar7 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
        sStack_58 = sVar7 + 1 + sStack_58;
      }
    }
    if ((uVar1 & 2) != 0) {
      sVar7 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.any_value_);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if (((uVar1 & 4) != 0) && (iVar4 = _internal_int32_value(this), iVar4 != 0)) {
      iVar4 = _internal_int32_value(this);
      sVar7 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar7 + sStack_58;
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestAny::ByteSizeLong() const {
  const TestAny& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAny)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Any repeated_any_value = 3;
    {
      total_size += 1UL * this_._internal_repeated_any_value_size();
      for (const auto& msg : this_._internal_repeated_any_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string text = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_text().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_text());
      }
    }
    // .google.protobuf.Any any_value = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_value_);
    }
    // int32 int32_value = 1;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_int32_value() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_int32_value());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}